

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void __thiscall hwnet::ThreadPool::~ThreadPool(ThreadPool *this)

{
  ulong uVar1;
  
  TaskQueue::Close(&this->queue_);
  if ((this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      std::thread::join();
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(this->threads_).
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->threads_).
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  std::deque<std::shared_ptr<hwnet::Task>,_std::allocator<std::shared_ptr<hwnet::Task>_>_>::~deque
            (&(this->queue_).tasks);
  std::_V2::condition_variable_any::~condition_variable_any(&(this->queue_).cv);
  return;
}

Assistant:

ThreadPool::~ThreadPool() {
	queue_.Close();
	size_t i = 0;
	for( ; i < threads_.size(); ++i) {
		threads_[i].join();
	}	
}